

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O0

int make_pidfile(void)

{
  char *pcVar1;
  int __fd;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  size_t __n;
  size_t sVar5;
  int local_40;
  pid_t pid;
  int rc;
  int fd;
  char pid_str [20];
  size_t pid_strlen;
  
  local_40 = -1;
  if (cfg.pidfile == (char *)0x0) {
    pid_strlen._4_4_ = 0;
  }
  else {
    __fd = open(cfg.pidfile,0x241,0x1a4);
    pcVar1 = cfg.pidfile;
    if (__fd == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      syslog(3,"can\'t open %s: %s\n",pcVar1,pcVar4);
    }
    else {
      uVar2 = getpid();
      snprintf((char *)&rc,0x14,"%u\n",(ulong)uVar2);
      __n = strlen((char *)&rc);
      sVar5 = write(__fd,&rc,__n);
      pcVar1 = cfg.pidfile;
      if (sVar5 == __n) {
        close(__fd);
        local_40 = 0;
      }
      else {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        syslog(3,"can\'t write to %s: %s\n",pcVar1,pcVar4);
        close(__fd);
        unlink(cfg.pidfile);
      }
    }
    pid_strlen._4_4_ = local_40;
  }
  return pid_strlen._4_4_;
}

Assistant:

int make_pidfile() {
  size_t pid_strlen;
  char pid_str[20];
  int fd,rc=-1;
  pid_t pid;

  if (!cfg.pidfile) return 0;

  fd = open(cfg.pidfile, O_WRONLY|O_TRUNC|O_CREAT, 0644);
  if (fd == -1) {
   syslog(LOG_ERR,"can't open %s: %s\n",cfg.pidfile, strerror(errno));
   goto done;
  }

  pid = getpid();
  snprintf(pid_str,sizeof(pid_str),"%u\n",(unsigned)pid);
  pid_strlen = strlen(pid_str);
  if (write(fd,pid_str,pid_strlen) != pid_strlen) {
   syslog(LOG_ERR,"can't write to %s: %s\n",cfg.pidfile, strerror(errno));
   close(fd);
   unlink(cfg.pidfile);
   goto done;
  }

  close(fd);
  rc = 0;

 done:
  return rc;
}